

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallmon.cpp
# Opt level: O2

pair<int,_unsigned_long_long> __thiscall
wallmon::get_mother_starttime(wallmon *this,pid_t mother_pid)

{
  ostream *poVar1;
  unsigned_long_long uVar2;
  undefined8 uVar3;
  char *pcVar4;
  pair<int,_unsigned_long_long> pVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5a8;
  string local_588;
  string tmp_str;
  stringstream strm;
  ostream local_538 [376];
  ifstream proc_stat;
  byte abStack_3a0 [488];
  stringstream stat_fname;
  ostream local_1a8 [376];
  
  local_5a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_5a8,0x34);
  tmp_str._M_dataplus._M_p = (pointer)&tmp_str.field_2;
  tmp_str._M_string_length = 0;
  tmp_str.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&stat_fname);
  poVar1 = std::operator<<(local_1a8,"/proc/");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,mother_pid);
  poVar1 = std::operator<<(poVar1,"/stat");
  std::ends<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::ifstream::ifstream(&proc_stat,(string *)&strm,_S_in);
  std::__cxx11::string::~string((string *)&strm);
  while( true ) {
    if ((abStack_3a0[*(long *)(_proc_stat + -0x18)] & 5) != 0) break;
    if (0x2bf < (ulong)((long)local_5a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_5a8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)) goto LAB_001ac7b3;
    std::operator>>((istream *)&proc_stat,(string *)&tmp_str);
    if ((abStack_3a0[*(long *)(_proc_stat + -0x18)] & 5) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_5a8,&tmp_str);
    }
  }
  if ((ulong)((long)local_5a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_5a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x2a1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&strm);
    poVar1 = std::operator<<(local_538,"Read only ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," from mother PID stat file");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(local_538,"Stream status of ");
    std::__cxx11::stringbuf::str();
    poVar1 = std::operator<<(poVar1,(string *)&local_588);
    poVar1 = std::operator<<(poVar1," is ");
    pcVar4 = "bad";
    if ((abStack_3a0[*(long *)(_proc_stat + -0x18)] & 5) == 0) {
      pcVar4 = "good";
    }
    poVar1 = std::operator<<(poVar1,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_588);
    std::__cxx11::stringbuf::str();
    MessageBase::warning(&this->super_MessageBase,&local_588);
    std::__cxx11::string::~string((string *)&local_588);
    std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
    uVar3 = 1;
    uVar2 = 0;
  }
  else {
LAB_001ac7b3:
    uVar3 = 0;
    uVar2 = std::__cxx11::stol(local_5a8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 0x15,(size_t *)0x0,10);
  }
  std::ifstream::~ifstream(&proc_stat);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stat_fname);
  std::__cxx11::string::~string((string *)&tmp_str);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5a8);
  pVar5.second = uVar2;
  pVar5._0_8_ = uVar3;
  return pVar5;
}

Assistant:

std::pair<int, unsigned long long> wallmon::get_mother_starttime(
    pid_t mother_pid) {
  std::vector<std::string> stat_entries{};
  stat_entries.reserve(52);
  std::string tmp_str{};
  unsigned long long start_time_clock_t;

  std::stringstream stat_fname{};
  stat_fname << "/proc/" << mother_pid << "/stat" << std::ends;
  std::ifstream proc_stat{stat_fname.str()};
  while (proc_stat && stat_entries.size() < prmon::uptime_pos + 1) {
    proc_stat >> tmp_str;
    if (proc_stat) stat_entries.push_back(tmp_str);
  }
  if (stat_entries.size() > prmon::uptime_pos) {
    start_time_clock_t = std::stol(stat_entries[prmon::uptime_pos]);
  } else {
    // Some error happened!
    std::stringstream strm;
    strm << "Read only " << stat_entries.size() << " from mother PID stat file"
         << std::endl;
    strm << "Stream status of " << stat_fname.str() << " is "
         << (proc_stat ? "good" : "bad") << std::endl;
    warning(strm.str());
    return std::pair<int, unsigned long long>{1, 0L};
  }
  return std::pair<int, unsigned long long>{0, start_time_clock_t};
}